

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::DeclarationStatement::tokenize
          (DeclarationStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_38;
  Token local_28;
  
  Variable::tokenizeDeclaration(this->m_variable,state,str);
  if (this->m_expression != (Expression *)0x0) {
    local_38.m_type = EQUAL;
    TokenStream::operator<<(str,&local_38);
    Token::~Token(&local_38);
    (*this->m_expression->_vptr_Expression[3])(this->m_expression,state,str);
  }
  local_38.m_type = SEMICOLON;
  this_00 = TokenStream::operator<<(str,&local_38);
  local_28.m_type = NEWLINE;
  TokenStream::operator<<(this_00,&local_28);
  Token::~Token(&local_28);
  Token::~Token(&local_38);
  return;
}

Assistant:

void DeclarationStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_variable->tokenizeDeclaration(state, str);

	if (m_expression)
	{
		str << Token::EQUAL;
		m_expression->tokenize(state, str);
	}

	str << Token::SEMICOLON << Token::NEWLINE;
}